

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_file_seek(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  JSValueUnion JVar3;
  int *piVar4;
  int64_t iVar5;
  JSValue JVar6;
  int whence;
  int64_t pos;
  int local_2c;
  __off_t local_28;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  iVar5 = 6;
  if (__stream != (FILE *)0x0) {
    iVar1 = JS_ToInt64Ext(ctx,&local_28,*argv);
    if (iVar1 == 0) {
      iVar1 = JS_ToInt32(ctx,&local_2c,argv[1]);
      if (iVar1 == 0) {
        uVar2 = fseeko(__stream,local_28,local_2c);
        if ((int)uVar2 < 0) {
          piVar4 = __errno_location();
          uVar2 = -*piVar4;
        }
        JVar3._4_4_ = 0;
        JVar3.int32 = uVar2;
        iVar5 = 0;
        goto LAB_00110c0a;
      }
    }
  }
  JVar3.float64 = 0.0;
LAB_00110c0a:
  JVar6.tag = iVar5;
  JVar6.u.float64 = JVar3.float64;
  return JVar6;
}

Assistant:

static JSValue js_std_file_seek(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int64_t pos;
    int whence, ret;
    if (!f)
        return JS_EXCEPTION;
    if (JS_ToInt64Ext(ctx, &pos, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &whence, argv[1]))
        return JS_EXCEPTION;
#if defined(__linux__)
    ret = fseeko(f, pos, whence);
#else
    ret = fseek(f, pos, whence);
#endif
    if (ret < 0)
        ret = -errno;
    return JS_NewInt32(ctx, ret);
}